

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

void ritobin::io::json_impl::value_to_json(Value *value,json *json)

{
  anon_class_8_1_898d99e6 local_20;
  json *local_18;
  json *json_local;
  Value *value_local;
  
  local_20.json = json;
  local_18 = json;
  json_local = (json *)value;
  std::
  visit<ritobin::io::json_impl::value_to_json(std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&)::__0,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>const&>
            (&local_20,value);
  return;
}

Assistant:

void value_to_json(Value const& value, json& json) noexcept {
        std::visit([&json](auto const& value) noexcept {
            using value_t = std::remove_cvref_t<decltype(value)>;
            json_value_impl<value_t>::to_json(value, json);
        }, value);
    }